

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O1

int read_int32_array(coda_cursor *cursor,int32_t *dst,coda_array_ordering array_ordering)

{
  coda_backend cVar1;
  int iVar2;
  
  cVar1 = (cursor->stack[(long)cursor->n + -1].type)->backend;
  switch(cVar1) {
  case coda_backend_memory:
    iVar2 = coda_mem_cursor_read_int32_array(cursor,dst,array_ordering);
    return iVar2;
  case coda_backend_hdf4:
    iVar2 = -0xb;
    goto LAB_001286b6;
  case coda_backend_hdf5:
    iVar2 = -0xd;
LAB_001286b6:
    coda_set_error(iVar2,(char *)0x0);
    return -1;
  case coda_backend_cdf:
    iVar2 = coda_cdf_cursor_read_int32_array(cursor,dst);
    break;
  case coda_backend_netcdf:
    iVar2 = coda_netcdf_cursor_read_int32_array(cursor,dst);
    break;
  case coda_backend_grib:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                  ,0x401,"int read_int32_array(const coda_cursor *, int32_t *, coda_array_ordering)"
                 );
  default:
    if (cVar1 == coda_backend_binary) {
      iVar2 = coda_bin_cursor_read_int32_array(cursor,dst,array_ordering);
      return iVar2;
    }
    if (cVar1 == coda_backend_ascii) {
      iVar2 = coda_ascii_cursor_read_int32_array(cursor,dst,array_ordering);
      return iVar2;
    }
    goto LAB_00128699;
  }
  if (iVar2 != 0) {
    return -1;
  }
LAB_00128699:
  if (array_ordering == coda_array_ordering_c) {
    return 0;
  }
  iVar2 = transpose_array(cursor,dst,4);
  return iVar2;
}

Assistant:

static int read_int32_array(const coda_cursor *cursor, int32_t *dst, coda_array_ordering array_ordering)
{
    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
            return coda_ascii_cursor_read_int32_array(cursor, dst, array_ordering);
        case coda_backend_binary:
            return coda_bin_cursor_read_int32_array(cursor, dst, array_ordering);
        case coda_backend_memory:
            return coda_mem_cursor_read_int32_array(cursor, dst, array_ordering);
        case coda_backend_hdf4:
#ifdef HAVE_HDF4
            if (coda_hdf4_cursor_read_int32_array(cursor, dst) != 0)
            {
                return -1;
            }
            break;
#else
            coda_set_error(CODA_ERROR_NO_HDF4_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_hdf5:
#ifdef HAVE_HDF5
            if (coda_hdf5_cursor_read_int32_array(cursor, dst) != 0)
            {
                return -1;
            }
            break;
#else
            coda_set_error(CODA_ERROR_NO_HDF5_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_cdf:
            if (coda_cdf_cursor_read_int32_array(cursor, dst) != 0)
            {
                return -1;
            }
            break;
        case coda_backend_netcdf:
            if (coda_netcdf_cursor_read_int32_array(cursor, dst) != 0)
            {
                return -1;
            }
            break;
        case coda_backend_grib:
            assert(0);
            exit(1);
    }

    if (array_ordering != coda_array_ordering_c)
    {
        return transpose_array(cursor, dst, sizeof(int32_t));
    }

    return 0;
}